

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.cpp
# Opt level: O3

double __thiscall pcd::random_signal_generator::impl::random_pm_one(impl *this)

{
  double dVar1;
  double dVar2;
  
  dVar2 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&this->random_generator);
  dVar1 = (this->distribution_pm_one)._M_param._M_a;
  return dVar2 * ((this->distribution_pm_one)._M_param._M_b - dVar1) + dVar1;
}

Assistant:

double random_signal_generator::impl::random_pm_one()
{
    return distribution_pm_one(random_generator);
}